

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,QPoint args_4,
               QPoint args_5,int args_6,Orientation args_7,QFlags<Qt::KeyboardModifier> args_8,
               ScrollPhase args_9,MouseEventSource args_10,bool args_11,QPointingDevice *args_12)

{
  long lVar1;
  QPoint angleD;
  QPointF args_3_00;
  QPointF args_2_00;
  uint uVar2;
  ulong uVar3;
  undefined8 in_RCX;
  QPoint in_RDX;
  unsigned_long in_RSI;
  QWindow *in_RDI;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_R8D;
  Orientation in_R9D;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  QPoint in_XMM2_Qa;
  qreal in_XMM3_Qa;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020;
  undefined8 in_stack_00000028;
  WheelEvent event;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar4;
  WindowSystemEvent *e;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe7c;
  QPoint in_stack_fffffffffffffe88;
  Representation in_stack_fffffffffffffea0;
  undefined3 in_stack_fffffffffffffea4;
  Representation RVar5;
  ScrollPhase in_stack_fffffffffffffec0;
  bool local_139;
  MouseEventSource in_stack_fffffffffffffec8;
  QPointingDevice *in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  QFlags<Qt::KeyboardModifier> QStack_f8;
  ScrollPhase in_stack_ffffffffffffff48;
  MouseEventSource in_stack_ffffffffffffff50;
  byte local_a8;
  QPointingDevice *in_stack_ffffffffffffff60;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RVar5.m_i = CONCAT13(in_stack_00000020,in_stack_fffffffffffffea4) & 0x1ffffff;
  uVar3 = QThread::isMainThread();
  QStack_f8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = SUB84((ulong)in_RCX >> 0x20,0);
  if ((uVar3 & 1) == 0) {
    args_2_00.yp._0_4_ = in_stack_ffffffffffffff00;
    args_2_00.xp = (qreal)in_XMM1_Qa;
    args_2_00.yp._4_4_ = in_stack_ffffffffffffff04;
    args_3_00.yp = in_XMM0_Qa;
    args_3_00.xp = in_XMM3_Qa;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
              (in_RDI,in_RSI,args_2_00,args_3_00,in_XMM2_Qa,in_RDX,in_R8D.i,in_R9D,QStack_f8,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,SUB41((uint)RVar5.m_i >> 0x18,0),
               in_stack_ffffffffffffff60);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_00000010),
               (ProcessEventsFlag)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    local_139 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)in_R8D.i);
    goto LAB_0044cb6b;
  }
  memcpy(&stack0xffffffffffffff48,&DAT_00ba3cd0,0x88);
  e = (WindowSystemEvent *)CONCAT44(uVar4,in_stack_00000010);
  angleD.yp.m_i = RVar5.m_i;
  angleD.xp.m_i = in_stack_fffffffffffffea0.m_i;
  QWindowSystemInterfacePrivate::WheelEvent::WheelEvent
            ((WheelEvent *)
             CONCAT44(in_stack_fffffffffffffe7c,(uint)((byte)((uint)RVar5.m_i >> 0x18) & 1)),
             (QWindow *)CONCAT44(in_stack_fffffffffffffe74,in_stack_00000018),(ulong)e,
             (QPointF *)CONCAT44(in_stack_fffffffffffffe64,in_stack_00000008),
             (QPointF *)CONCAT44(in_stack_fffffffffffffe5c,in_R9D),in_stack_fffffffffffffe88,angleD,
             in_R9D,(Orientation)in_RSI,(KeyboardModifiers)in_stack_00000028._4_4_,
             in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
             SUB41((uint)in_stack_fffffffffffffe54 >> 0x18,0),in_stack_fffffffffffffed8);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(e);
LAB_0044ca27:
    local_139 = (bool)(local_a8 & 1);
  }
  else {
    uVar2 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&stack0xffffffffffffff48);
    if ((uVar2 & 1) != 0) goto LAB_0044ca27;
    local_139 = false;
  }
  QWindowSystemInterfacePrivate::WheelEvent::~WheelEvent((WheelEvent *)0x44ca49);
LAB_0044cb6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_139;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}